

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URITest.cpp
# Opt level: O1

void __thiscall jaegertracing::net::URI_testMatch_Test::TestBody(URI_testMatch_Test *this)

{
  internal iVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  int local_ec;
  internal local_e8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  long *local_b8 [2];
  long local_a8 [2];
  undefined1 *local_98;
  undefined1 local_88 [16];
  int local_78 [2];
  undefined1 *local_70;
  undefined1 local_60 [16];
  undefined1 *local_50;
  undefined1 local_40 [16];
  
  local_ec = 0;
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"http://localhost","");
  jaegertracing::net::URI::parse((string *)local_b8);
  testing::internal::CmpHelperEQ<int,int>
            (local_e8,"0","URI::parse(\"http://localhost\")._port",&local_ec,local_78);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0]);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0]);
  }
  iVar1 = local_e8[0];
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_e0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_e0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
    if (local_b8[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_b8[0] != (long *)0x0)) {
        (**(code **)(*local_b8[0] + 8))();
      }
      local_b8[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (iVar1 != (internal)0x0) {
    local_ec = 0x50;
    local_d8[0] = local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"http://localhost:80","");
    jaegertracing::net::URI::parse((string *)local_b8);
    testing::internal::CmpHelperEQ<int,int>
              (local_e8,"80","URI::parse(\"http://localhost:80\")._port",&local_ec,local_78);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    if (local_98 != local_88) {
      operator_delete(local_98);
    }
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0]);
    }
    if (local_d8[0] != local_c8) {
      operator_delete(local_d8[0]);
    }
    if (local_e8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_b8);
      if (local_e0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_e0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                 ,0x1f,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)local_b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
      if (local_b8[0] != (long *)0x0) {
        cVar2 = testing::internal::IsTrue(true);
        if ((cVar2 != '\0') && (local_b8[0] != (long *)0x0)) {
          (**(code **)(*local_b8[0] + 8))();
        }
        local_b8[0] = (long *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  return;
}

Assistant:

TEST(URI, testMatch)
{
    ASSERT_EQ(0, URI::parse("http://localhost")._port);
    ASSERT_EQ(80, URI::parse("http://localhost:80")._port);
}